

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

FuncNode * __thiscall asmjit::BaseCompiler::addFunc(BaseCompiler *this,FuncNode *func)

{
  byte bVar1;
  int iVar2;
  anon_union_8_2_effa25e6_for_BaseNode_9 aVar3;
  char *pcVar4;
  uint8_t uVar5;
  Error EVar6;
  BaseNode *pBVar7;
  FuncNode *pFVar8;
  FuncNode *extraout_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Operand_ *in_RCX;
  Operand_ *o1;
  int *extraout_RDX;
  Operand_ *o0;
  uint32_t unaff_EBX;
  FuncNode *out;
  BaseCompiler *this_00;
  int *unaff_R12;
  BaseCompiler *unaff_R13;
  Operand_ *unaff_R15;
  uint8_t uStack_59;
  FuncNode *pFStack_58;
  size_t sStack_50;
  
  if (this->_func == (FuncNode *)0x0) {
    this->_func = func;
    BaseBuilder::addNode(&this->super_BaseBuilder,(BaseNode *)func);
    pBVar7 = (this->super_BaseBuilder)._cursor;
    BaseBuilder::addNode(&this->super_BaseBuilder,&func->_exitNode->super_BaseNode);
    BaseBuilder::addNode(&this->super_BaseBuilder,&func->_end->super_BaseNode);
    (this->super_BaseBuilder)._cursor = pBVar7;
    return func;
  }
  addFunc();
  iVar2 = *extraout_RDX;
  if ((this->super_BaseBuilder)._allocator._zone == (Zone *)0x0) {
    _newRetNode();
    pFVar8 = extraout_RAX;
    o1 = in_RCX;
    out = func;
    this_00 = this;
  }
  else {
    unaff_EBX = in_RCX->_signature;
    this_00 = (BaseCompiler *)&(this->super_BaseBuilder)._allocator;
    out = (FuncNode *)0x80;
    o1 = in_RCX;
    pBVar7 = (BaseNode *)ZoneAllocator::_alloc((ZoneAllocator *)this_00,0x80,&sStack_50);
    pFVar8 = (FuncNode *)0x0;
    unaff_R12 = extraout_RDX;
    unaff_R13 = this;
    unaff_R15 = in_RCX;
    uStack_59 = iVar2 != 0;
    pFStack_58 = func;
    if (pBVar7 != (BaseNode *)0x0) {
      (pBVar7->field_0).field_0._prev = (BaseNode *)0x0;
      (pBVar7->field_0).field_0._next = (BaseNode *)0x0;
      (pBVar7->field_1)._any._nodeType = '\x01';
      (pBVar7->field_1)._any._nodeFlags = (byte)(this->super_BaseBuilder)._nodeFlags | 0x29;
      *(undefined8 *)((long)&pBVar7->field_1 + 2) = 0;
      *(undefined8 *)((long)&pBVar7->field_3 + 2) = 0;
      pBVar7->_passData = (void *)0x0;
      pBVar7->_inlineComment = (char *)0x0;
      o1 = (Operand_ *)0x80000000;
      pBVar7[1].field_0.field_0._prev = (BaseNode *)0x80000000;
      pBVar7[1].field_0.field_0._next = (BaseNode *)0x0;
      *(undefined2 *)((long)&pBVar7->field_1 + 2) = 0x400;
      (pBVar7->field_1)._any._nodeType = '\x11';
      goto LAB_00116649;
    }
  }
  pBVar7 = (BaseNode *)0x0;
LAB_00116649:
  if (pBVar7 == (BaseNode *)0x0) {
    out = (FuncNode *)0x1;
    EVar6 = BaseEmitter::reportError((BaseEmitter *)unaff_R13,1,(char *)0x0);
    pFVar8 = (FuncNode *)CONCAT44(extraout_var,EVar6);
    this_00 = unaff_R13;
  }
  if ((int)pFVar8 != 0) {
    return pFVar8;
  }
  uVar5 = '\x02';
  if (unaff_EBX == 0) {
    uVar5 = uStack_59;
  }
  (pBVar7->field_1)._any._reserved0 = uVar5;
  bVar1 = (pBVar7->field_1)._any._reserved1;
  if (bVar1 == 0) {
    _newRetNode();
  }
  else {
    iVar2 = unaff_R12[1];
    aVar3 = *(anon_union_8_2_effa25e6_for_BaseNode_9 *)(unaff_R12 + 2);
    pBVar7[1].field_1 = (anon_union_4_4_9308554c_for_BaseNode_2)unaff_R12[0];
    pBVar7[1]._position = iVar2;
    pBVar7[1].field_3 = aVar3;
    if (bVar1 != 1) {
      pcVar4 = *(char **)unaff_R15->_data;
      pBVar7[1]._passData = *(void **)unaff_R15;
      pBVar7[1]._inlineComment = pcVar4;
      if (2 < bVar1) {
        memset(pBVar7 + 2,0,((ulong)bVar1 * 0x10 + 0xfffffffd0 & 0xffffffff0) + 0x10);
      }
      (pFStack_58->super_LabelNode).super_BaseNode.field_0.field_0._prev = pBVar7;
      return (FuncNode *)0x0;
    }
  }
  _newRetNode();
  EVar6 = _newRetNode(this_00,(FuncRetNode **)out,o0,o1);
  pFVar8 = (FuncNode *)CONCAT44(extraout_var_00,EVar6);
  if (EVar6 == 0) {
    BaseBuilder::addNode
              (&this_00->super_BaseBuilder,
               (out->super_LabelNode).super_BaseNode.field_0.field_0._prev);
    pFVar8 = (FuncNode *)0x0;
  }
  return pFVar8;
}

Assistant:

FuncNode* BaseCompiler::addFunc(FuncNode* func) {
  ASMJIT_ASSERT(_func == nullptr);
  _func = func;

  addNode(func);                 // Function node.
  BaseNode* prev = cursor();     // {CURSOR}.
  addNode(func->exitNode());     // Function exit label.
  addNode(func->endNode());      // Function end sentinel.

  _setCursor(prev);
  return func;
}